

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

bool __thiscall BinGE<0,_0,_0>::propagate(BinGE<0,_0,_0> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  IntVar *pIVar4;
  long lVar5;
  bool bVar6;
  IntVar *pIVar7;
  int64_t m_v;
  TrailElem local_30;
  
  pIVar4 = (this->x).var;
  pIVar7 = (this->y).var;
  iVar3 = (pIVar4->max).v;
  iVar2 = (pIVar7->min).v;
  if ((pIVar4->min).v < iVar2) {
    if (so.lazy) {
      iVar1 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[8])();
      lVar5 = (long)iVar1 * 4 + 2;
      pIVar4 = (this->x).var;
    }
    else {
      lVar5 = 0;
    }
    iVar2 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xe])(pIVar4,(long)iVar2,lVar5,1);
    if ((char)iVar2 != '\0') {
      pIVar7 = (this->y).var;
      goto LAB_001b251e;
    }
LAB_001b25a5:
    bVar6 = false;
  }
  else {
LAB_001b251e:
    iVar2 = (pIVar7->max).v;
    if (iVar3 < iVar2) {
      if (so.lazy == true) {
        iVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
        lVar5 = (long)iVar2 * 4 + 2;
        pIVar7 = (this->y).var;
      }
      else {
        lVar5 = 0;
      }
      iVar3 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar7,(long)iVar3,lVar5,1);
      if ((char)iVar3 == '\0') goto LAB_001b25a5;
      iVar2 = (((this->y).var)->max).v;
    }
    bVar6 = true;
    if (iVar2 <= (((this->x).var)->min).v) {
      local_30.pt = (int *)&(this->super_Propagator).satisfied;
      local_30.x = (int)(this->super_Propagator).satisfied.v;
      local_30.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_30);
      (this->super_Propagator).satisfied.v = '\x01';
    }
  }
  return bVar6;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}